

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::visit(Executor *this,ProgramNode *node)

{
  bool bVar1;
  pointer pVVar2;
  pointer pFVar3;
  reference_wrapper<RuntimeSymbol> *this_00;
  RuntimeSymbol *pRVar4;
  element_type *peVar5;
  pointer pVVar6;
  RuntimeFunctionAnalyser *this_01;
  ProgramNode *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  optional<std::reference_wrapper<RuntimeSymbol>_> oVar7;
  NumberValueAnalyser valueAnalyser;
  RuntimeFunctionAnalyser functionAnalyser;
  optional<std::reference_wrapper<RuntimeSymbol>_> mainSymbol;
  unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_> *function;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  list<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
  *__range1_1;
  unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_> *variable;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
  *__range1;
  list<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
  *in_stack_fffffffffffffeb8;
  RuntimeFunctionAnalyser *in_stack_fffffffffffffec0;
  allocator<char> *__a;
  allocator<char> *__s;
  undefined1 local_f8 [8];
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  _Storage<double,_true> in_stack_ffffffffffffff18;
  Context *in_stack_ffffffffffffff20;
  RuntimeFunctionAnalyser local_d8;
  allocator<char> local_81;
  string local_80 [32];
  _Storage<std::reference_wrapper<RuntimeSymbol>,_true> local_60;
  undefined1 local_58;
  reference local_50;
  _Self local_48;
  _Self local_40;
  list<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
  *local_38;
  reference local_30;
  _Self local_28;
  _Self local_20;
  list<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
  *local_18;
  ProgramNode *local_10;
  
  local_10 = in_RSI;
  local_18 = ProgramNode::getVariables_abi_cxx11_(in_RSI);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
       ::begin((list<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
                *)in_stack_fffffffffffffeb8);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
       ::end((list<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
              *)in_stack_fffffffffffffeb8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_30 = std::
               _List_const_iterator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>
               ::operator*((_List_const_iterator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>
                            *)in_stack_fffffffffffffec0);
    pVVar2 = std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>
             ::operator->((unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>
                           *)0x15c720);
    (*(pVVar2->super_StatementNode).super_Node._vptr_Node[2])(pVVar2,in_RDI);
    std::
    _List_const_iterator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>
    ::operator++(&local_20);
  }
  local_38 = ProgramNode::getFunctions_abi_cxx11_(local_10);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
       ::begin(in_stack_fffffffffffffeb8);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
       ::end(in_stack_fffffffffffffeb8);
  while( true ) {
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    local_50 = std::
               _List_const_iterator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>
               ::operator*((_List_const_iterator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>
                            *)in_stack_fffffffffffffec0);
    pFVar3 = std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>
             ::operator->((unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>
                           *)0x15c7b9);
    (*(pFVar3->super_StatementNode).super_Node._vptr_Node[2])(pFVar3,in_RDI);
    std::
    _List_const_iterator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>
    ::operator++(&local_40);
  }
  __a = (allocator<char> *)&in_RDI->field_2;
  __s = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,__a);
  oVar7 = Context::lookup(in_stack_ffffffffffffff20,(string *)in_stack_ffffffffffffff18,
                          in_stack_ffffffffffffff14);
  local_60 = oVar7.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>.
             _M_payload.super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>.
             _M_payload;
  local_58 = oVar7.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>.
             _M_payload.super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>.
             _M_engaged;
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  RuntimeFunctionAnalyser::RuntimeFunctionAnalyser(in_stack_fffffffffffffec0);
  this_00 = std::optional<std::reference_wrapper<RuntimeSymbol>_>::value
                      ((optional<std::reference_wrapper<RuntimeSymbol>_> *)in_stack_fffffffffffffec0
                      );
  pRVar4 = std::reference_wrapper<RuntimeSymbol>::get(this_00);
  (*pRVar4->_vptr_RuntimeSymbol[2])(pRVar4,&local_d8);
  Context::enterScope((Context *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  RuntimeFunctionAnalyser::getBody(&local_d8);
  peVar5 = std::__shared_ptr_access<BlockNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<BlockNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x15c8c8);
  (*(peVar5->super_StatementNode).super_Node._vptr_Node[2])(peVar5,in_RDI);
  Context::leaveScope((Context *)0x15c8e9);
  NumberValueAnalyser::NumberValueAnalyser((NumberValueAnalyser *)in_stack_fffffffffffffec0);
  pVVar6 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                     ((unique_ptr<Value,_std::default_delete<Value>_> *)0x15c905);
  (*pVVar6->_vptr_Value[3])(pVVar6,local_f8);
  NumberValueAnalyser::getValue((NumberValueAnalyser *)local_f8);
  this_01 = (RuntimeFunctionAnalyser *)
            std::optional<double>::value((optional<double> *)in_stack_fffffffffffffec0);
  *(int *)&in_RDI[0x11]._M_string_length =
       (int)(double)(this_01->super_RuntimeSymbolVisitor)._vptr_RuntimeSymbolVisitor;
  NumberValueAnalyser::~NumberValueAnalyser((NumberValueAnalyser *)0x15c958);
  RuntimeFunctionAnalyser::~RuntimeFunctionAnalyser(this_01);
  return;
}

Assistant:

void Executor::visit(const ProgramNode& node)
{
  for(const auto& variable : node.getVariables())
    variable->accept(*this);

  for(const auto& function : node.getFunctions())
    function->accept(*this);

  const auto mainSymbol = context_.lookup("main");
  auto functionAnalyser = RuntimeFunctionAnalyser{};
  mainSymbol.value().get().accept(functionAnalyser);

  context_.enterScope();
  functionAnalyser.getBody()->accept(*this);
  context_.leaveScope();

  auto valueAnalyser = NumberValueAnalyser{};
  value_->accept(valueAnalyser);
  exitCode_ = valueAnalyser.getValue().value();
}